

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin2psf1.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tags_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  int *piVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  char *strtol_endp;
  ulong local_11a8;
  char *local_11a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tags;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1168;
  char region [256];
  char psf_path [4096];
  
  memset(psf_path,0,0x1000);
  memset(region,0,0x100);
  iVar10 = 1;
  do {
    if ((argc <= iVar10) || (pcVar8 = argv[iVar10], *pcVar8 != '-')) {
      if (argc - iVar10 == 4) {
        pcVar8 = argv[iVar10];
        if (psf_path[0] == '\0') {
          strcpy(psf_path,pcVar8);
          pcVar9 = strrchr(psf_path,0x2e);
          pcVar3 = strrchr(psf_path,0x2f);
          if (pcVar9 <= pcVar3) {
            sVar4 = strlen(psf_path);
            pcVar9 = psf_path + sVar4;
          }
          *pcVar9 = '\0';
          sVar4 = strlen(psf_path);
          builtin_strncpy(psf_path + sVar4,".psf",5);
        }
        uVar5 = strtoul(argv[(long)iVar10 + 1],&strtol_endp,0x10);
        if ((*strtol_endp == '\0') && (piVar6 = __errno_location(), *piVar6 != 0x22)) {
          local_11a0 = pcVar8;
          uVar7 = strtoul(argv[(long)iVar10 + 2],&strtol_endp,0x10);
          if ((*strtol_endp == '\0') && (*piVar6 != 0x22)) {
            local_11a8 = uVar7;
            uVar7 = strtoul(argv[(long)iVar10 + 3],&strtol_endp,0x10);
            if ((*strtol_endp == '\0') && (*piVar6 != 0x22)) {
              tags._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &tags._M_t._M_impl.super__Rb_tree_header._M_header;
              tags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              tags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              tags._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              tags._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   tags._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::_Rb_tree(&local_1168,&tags._M_t);
              tags_00._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = strtol_endp;
              tags_00._M_t._M_impl._0_8_ = &local_1168;
              tags_00._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_11a8
              ;
              tags_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_11a0;
              tags_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)tags._M_t._M_impl._0_8_;
              tags_00._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
                   tags._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
              tags_00._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
                   tags._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
              bVar1 = bin2psf1(local_11a0,psf_path,(uint32_t)uVar5,(uint32_t)local_11a8,
                               (uint32_t)uVar7,region,tags_00);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&local_1168);
              if (!bVar1) {
                fwrite("Error: Unable to convert to PSF1 format\n",0x28,1,_stderr);
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&tags._M_t);
              return (uint)!bVar1;
            }
            pcVar8 = argv[(long)iVar10 + 3];
          }
          else {
            pcVar8 = argv[(long)iVar10 + 2];
          }
        }
        else {
          pcVar8 = argv[(long)iVar10 + 1];
        }
        pcVar9 = "Error: Number format error \"%s\"\n";
      }
      else {
        fwrite("Error: Too few/more arguments.\n",0x1f,1,_stderr);
        fputc(10,_stderr);
        pcVar8 = *argv;
        pcVar9 = "Run \"%s --help\" for help.\n";
      }
LAB_00105c94:
      fprintf(_stderr,pcVar9,pcVar8);
      return 1;
    }
    iVar2 = strcmp(pcVar8,"--help");
    if (iVar2 == 0) {
      printUsage(*argv);
      return 0;
    }
    if (((pcVar8[1] == 'o') && (pcVar8[2] == '\0')) ||
       (iVar2 = strcmp(pcVar8,"--out-filename"), iVar2 == 0)) {
      pcVar9 = psf_path;
    }
    else {
      if (((pcVar8[1] != 'r') || (pcVar8[2] != '\0')) &&
         (iVar2 = strcmp(pcVar8,"--region"), iVar2 != 0)) {
        pcVar9 = "Error: Unknown option \"%s\"\n";
        goto LAB_00105c94;
      }
      pcVar9 = region;
    }
    if (argc <= iVar10 + 1) {
      pcVar9 = "Error: Too few arguments for \"%s\".\n";
      goto LAB_00105c94;
    }
    strcpy(pcVar9,argv[iVar10 + 1]);
    iVar10 = iVar10 + 2;
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
	int argnum;
	int argi;

	unsigned long ulvalue;
	char * strtol_endp;

	char psf_path[PATH_MAX] = { '\0' };

	char region[256] = { '\0' };

	argi = 1;
	while (argi < argc && argv[argi][0] == '-') {
		if (strcmp(argv[argi], "--help") == 0) {
			printUsage(argv[0]);
			return EXIT_SUCCESS;
		}
		else if (strcmp(argv[argi], "-o") == 0 || strcmp(argv[argi], "--out-filename") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\".\n", argv[argi]);
				return EXIT_FAILURE;
			}
			strcpy(psf_path, argv[argi + 1]);
			argi++;
		}
		else if (strcmp(argv[argi], "-r") == 0 || strcmp(argv[argi], "--region") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\".\n", argv[argi]);
				return EXIT_FAILURE;
			}
			strcpy(region, argv[argi + 1]);
			argi++;
		}
		else {
			fprintf(stderr, "Error: Unknown option \"%s\"\n", argv[argi]);
			return EXIT_FAILURE;
		}
		argi++;
	}

	argnum = argc - argi;
	if (argnum != 4) {
		fprintf(stderr, "Error: Too few/more arguments.\n");
		fprintf(stderr, "\n");
		fprintf(stderr, "Run \"%s --help\" for help.\n", argv[0]);
		return EXIT_FAILURE;
	}

	char * bin_path = argv[argi];

	if (psf_path[0] == '\0') {
		strcpy(psf_path, bin_path);
		path_stripext(psf_path);
		strcat(psf_path, ".psf");
	}

	ulvalue = strtoul(argv[argi + 1], &strtol_endp, 16);
	if (*strtol_endp != '\0' || errno == ERANGE) {
		fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 1]);
		return EXIT_FAILURE;
	}
	uint32_t load_address = ulvalue;

	ulvalue = strtoul(argv[argi + 2], &strtol_endp, 16);
	if (*strtol_endp != '\0' || errno == ERANGE) {
		fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 2]);
		return EXIT_FAILURE;
	}
	uint32_t initial_pc = ulvalue;

	ulvalue = strtoul(argv[argi + 3], &strtol_endp, 16);
	if (*strtol_endp != '\0' || errno == ERANGE) {
		fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 3]);
		return EXIT_FAILURE;
	}
	uint32_t initial_sp = ulvalue;

	std::map<std::string, std::string> tags;
	if (!bin2psf1(bin_path, psf_path, load_address, initial_pc, initial_sp, region, tags)) {
		fprintf(stderr, "Error: Unable to convert to PSF1 format\n");
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}